

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O3

bool __thiscall
CommandLineArguments::SetOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  bool bVar1;
  OutputType OVar2;
  size_t sVar3;
  int ac_00;
  SimpleString outputType;
  SimpleString local_40;
  undefined1 local_38 [16];
  
  ac_00 = 0x1b29ec;
  SimpleString::SimpleString(&local_40,"-o");
  getParameterField((CommandLineArguments *)local_38,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&local_40);
  sVar3 = SimpleString::size((SimpleString *)local_38);
  if (sVar3 == 0) {
LAB_001abff2:
    bVar1 = false;
  }
  else {
    SimpleString::SimpleString(&local_40,"normal");
    bVar1 = operator==((SimpleString *)local_38,&local_40);
    if (bVar1) {
      SimpleString::~SimpleString(&local_40);
      OVar2 = OUTPUT_ECLIPSE;
    }
    else {
      SimpleString::SimpleString((SimpleString *)(local_38 + 8),"eclipse");
      bVar1 = operator==((SimpleString *)local_38,(SimpleString *)(local_38 + 8));
      SimpleString::~SimpleString((SimpleString *)(local_38 + 8));
      SimpleString::~SimpleString(&local_40);
      OVar2 = OUTPUT_ECLIPSE;
      if (!bVar1) {
        SimpleString::SimpleString(&local_40,"junit");
        bVar1 = operator==((SimpleString *)local_38,&local_40);
        SimpleString::~SimpleString(&local_40);
        OVar2 = OUTPUT_JUNIT;
        if (!bVar1) {
          SimpleString::SimpleString(&local_40,"teamcity");
          bVar1 = operator==((SimpleString *)local_38,&local_40);
          SimpleString::~SimpleString(&local_40);
          OVar2 = OUTPUT_TEAMCITY;
          if (!bVar1) goto LAB_001abff2;
        }
      }
    }
    this->outputType_ = OVar2;
    bVar1 = true;
  }
  SimpleString::~SimpleString((SimpleString *)local_38);
  return bVar1;
}

Assistant:

bool CommandLineArguments::SetOutputType(int ac, const char** av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}